

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageLoader.cpp
# Opt level: O2

bool __thiscall
sf::priv::ImageLoader::loadImageFromStream
          (ImageLoader *this,InputStream *stream,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pixels,Vector2u *size)

{
  pointer puVar1;
  stbi_uc *__src;
  ostream *poVar2;
  long in_FS_OFFSET;
  int height;
  int width;
  int channels;
  stbi_io_callbacks callbacks;
  
  puVar1 = (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  (**(code **)(*(long *)stream + 0x18))(stream,0);
  callbacks.read = anon_unknown.dwarf_2d0aac::read;
  callbacks.skip = anon_unknown.dwarf_2d0aac::skip;
  callbacks.eof = anon_unknown.dwarf_2d0aac::eof;
  width = 0;
  height = 0;
  channels = 0;
  __src = stbi_load_from_callbacks(&callbacks,stream,&width,&height,&channels,4);
  if (__src == (stbi_uc *)0x0) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to load image from stream. Reason: ");
    poVar2 = std::operator<<(poVar2,*(char **)(in_FS_OFFSET + -0x68));
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    size->x = width;
    size->y = height;
    if (height != 0 && width != 0) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (pixels,(long)(width * height * 4));
      puVar1 = (pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      memcpy(puVar1,__src,
             (long)(pixels->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
    }
    free(__src);
  }
  return __src != (stbi_uc *)0x0;
}

Assistant:

bool ImageLoader::loadImageFromStream(InputStream& stream, std::vector<Uint8>& pixels, Vector2u& size)
{
    // Clear the array (just in case)
    pixels.clear();

    // Make sure that the stream's reading position is at the beginning
    stream.seek(0);

    // Setup the stb_image callbacks
    stbi_io_callbacks callbacks;
    callbacks.read = &read;
    callbacks.skip = &skip;
    callbacks.eof  = &eof;

    // Load the image and get a pointer to the pixels in memory
    int width = 0;
    int height = 0;
    int channels = 0;
    unsigned char* ptr = stbi_load_from_callbacks(&callbacks, &stream, &width, &height, &channels, STBI_rgb_alpha);

    if (ptr)
    {
        // Assign the image properties
        size.x = static_cast<unsigned int>(width);
        size.y = static_cast<unsigned int>(height);

        if (width && height)
        {
            // Copy the loaded pixels to the pixel buffer
            pixels.resize(static_cast<std::size_t>(width * height * 4));
            memcpy(&pixels[0], ptr, pixels.size());
        }

        // Free the loaded pixels (they are now in our own pixel buffer)
        stbi_image_free(ptr);

        return true;
    }
    else
    {
        // Error, failed to load the image
        err() << "Failed to load image from stream. Reason: " << stbi_failure_reason() << std::endl;

        return false;
    }
}